

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O2

string * __thiscall
CoreML::sequenceTypeToString_abi_cxx11_
          (string *__return_storage_ptr__,CoreML *this,TypeCase seqType)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_b;
  allocator<char> local_a;
  allocator<char> local_9;
  
  if ((int)this == 0) {
    __s = "Invalid";
    __a = &local_b;
  }
  else if ((int)this == 3) {
    __s = "String";
    __a = &local_a;
  }
  else {
    __s = "Int64";
    __a = &local_9;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

static std::string sequenceTypeToString(Specification::SequenceFeatureType::TypeCase seqType) {
        switch (seqType) {
            case Specification::SequenceFeatureType::kInt64Type:
                return "Int64";
            case Specification::SequenceFeatureType::kStringType:
                return "String";
            case Specification::SequenceFeatureType::TYPE_NOT_SET:
                return "Invalid";
        }
    }